

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

void emit_varname_or_constant(Function *fn,Pseudo *pseudo)

{
  ravitype_t local_1c;
  ravitype_t typecode;
  Pseudo *pseudo_local;
  Function *fn_local;
  
  if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0x5) {
    if (((pseudo->field_3).constant)->type == 8) {
      raviX_buffer_add_fstring(&fn->body,"%lld",((pseudo->field_3).proc)->nodes);
    }
    else if (((pseudo->field_3).constant)->type == 0x10) {
      raviX_buffer_add_double(&fn->body,(((pseudo->field_3).constant)->field_2).n);
    }
    else {
      handle_error_bad_pseudo(fn,pseudo,"emit_varname_or_constant: Unexpected pseudo type");
    }
  }
  else if (((((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0x2) ||
           (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0x3)) ||
          (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0x1)) {
    emit_varname(fn,pseudo);
  }
  else if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0x0) {
    local_1c = RAVI_TANY;
    if (((pseudo->field_3).symbol)->symbol_type == SYM_LOCAL) {
      local_1c = (((pseudo->field_3).symbol)->field_1).variable.value_type.type_code;
    }
    else if (((pseudo->field_3).symbol)->symbol_type == SYM_UPVALUE) {
      local_1c = (((pseudo->field_3).symbol)->field_1).variable.value_type.type_code;
    }
    if (local_1c == RAVI_TNUMFLT) {
      raviX_buffer_add_string(&fn->body,"fltvalue(");
      emit_reg_accessor(fn,pseudo,0);
      raviX_buffer_add_string(&fn->body,")");
    }
    else if (local_1c == RAVI_TNUMINT) {
      raviX_buffer_add_string(&fn->body,"ivalue(");
      emit_reg_accessor(fn,pseudo,0);
      raviX_buffer_add_string(&fn->body,")");
    }
    else {
      handle_error_bad_pseudo(fn,pseudo,"emit_varname_or_constant: Unexpected pseudo");
    }
  }
  else {
    handle_error_bad_pseudo(fn,pseudo,"emit_varname_or_constant: Unexpected pseudo");
  }
  return;
}

Assistant:

static void emit_varname_or_constant(Function *fn, Pseudo *pseudo)
{
	if (pseudo->type == PSEUDO_CONSTANT) {
		if (pseudo->constant->type == RAVI_TNUMINT) {
			raviX_buffer_add_fstring(&fn->body, "%lld", pseudo->constant->i);
		} else if (pseudo->constant->type == RAVI_TNUMFLT) {
			raviX_buffer_add_double(&fn->body, pseudo->constant->n);
		} else {
			handle_error_bad_pseudo(fn, pseudo, "emit_varname_or_constant: Unexpected pseudo type");
		}
	} else if (pseudo->type == PSEUDO_TEMP_INT || pseudo->type == PSEUDO_TEMP_BOOL ||
		   pseudo->type == PSEUDO_TEMP_FLT) {
		emit_varname(fn, pseudo);
	} else if (pseudo->type == PSEUDO_SYMBOL) {
		ravitype_t typecode = RAVI_TANY;
		if (pseudo->symbol->symbol_type == SYM_LOCAL) {
			typecode = pseudo->symbol->variable.value_type.type_code;
		} else if (pseudo->symbol->symbol_type == SYM_UPVALUE) {
			typecode = pseudo->symbol->upvalue.value_type.type_code;
		}
		if (typecode == RAVI_TNUMFLT) {
			raviX_buffer_add_string(&fn->body, "fltvalue(");
			emit_reg_accessor(fn, pseudo, 0); // discriminator not used
			raviX_buffer_add_string(&fn->body, ")");
		} else if (typecode == RAVI_TNUMINT) {
			raviX_buffer_add_string(&fn->body, "ivalue(");
			emit_reg_accessor(fn, pseudo, 0); // discriminator not used
			raviX_buffer_add_string(&fn->body, ")");
		} else {
			handle_error_bad_pseudo(fn, pseudo, "emit_varname_or_constant: Unexpected pseudo");
		}
	} else {
		handle_error_bad_pseudo(fn, pseudo, "emit_varname_or_constant: Unexpected pseudo");
	}
}